

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_write_header(mtar_t *tar,mtar_header_t *h)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  size_t sVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  mtar_raw_header_t rh;
  char local_220 [100];
  char local_1bc [8];
  char local_1b4 [16];
  char local_1a4 [12];
  char local_198 [12];
  char local_18c [7];
  undefined1 local_185;
  undefined1 local_184;
  char local_183 [355];
  
  if (h->size >> 0x21 == 0) {
    memset(local_220,0,0x200);
    sprintf(local_1bc,"%o",(ulong)h->mode);
    sprintf(local_1b4,"%o",(ulong)h->owner);
    sprintf(local_1a4,"%llo",h->size);
    sprintf(local_198,"%o",(ulong)h->mtime);
    uVar13 = 0x30;
    if (h->type != 0) {
      uVar13 = h->type;
    }
    local_184 = (undefined1)uVar13;
    sVar11 = strlen(h->name);
    if (sVar11 < 100) {
      sVar11 = strlen(h->linkname);
      if (sVar11 < 100) {
        strcpy(local_220,h->name);
        strcpy(local_183,h->linkname);
        iVar14 = 0x100;
        iVar15 = 0;
        iVar16 = 0;
        iVar17 = 0;
        lVar12 = 0;
        do {
          uVar1 = *(undefined4 *)(local_220 + lVar12);
          uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
          auVar2._8_4_ = 0;
          auVar2._0_8_ = uVar8;
          auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
          auVar3[8] = (char)((uint)uVar1 >> 0x10);
          auVar3._0_8_ = uVar8;
          auVar3[9] = 0;
          auVar3._10_3_ = auVar2._10_3_;
          auVar9._5_8_ = 0;
          auVar9._0_5_ = auVar3._8_5_;
          auVar4[4] = (char)((uint)uVar1 >> 8);
          auVar4._0_4_ = (int)uVar8;
          auVar4[5] = 0;
          auVar4._6_7_ = SUB137(auVar9 << 0x40,6);
          iVar14 = iVar14 + (int)uVar8;
          iVar15 = iVar15 + auVar4._4_4_;
          iVar16 = iVar16 + auVar3._8_4_;
          iVar17 = iVar17 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x94);
        iVar14 = iVar17 + iVar15 + iVar16 + iVar14;
        iVar15 = 0;
        iVar16 = 0;
        iVar17 = 0;
        lVar12 = 0x9c;
        do {
          uVar1 = *(undefined4 *)(local_220 + lVar12);
          uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar8;
          auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
          auVar6[8] = (char)((uint)uVar1 >> 0x10);
          auVar6._0_8_ = uVar8;
          auVar6[9] = 0;
          auVar6._10_3_ = auVar5._10_3_;
          auVar10._5_8_ = 0;
          auVar10._0_5_ = auVar6._8_5_;
          auVar7[4] = (char)((uint)uVar1 >> 8);
          auVar7._0_4_ = (int)uVar8;
          auVar7[5] = 0;
          auVar7._6_7_ = SUB137(auVar10 << 0x40,6);
          iVar14 = iVar14 + (int)uVar8;
          iVar15 = iVar15 + auVar7._4_4_;
          iVar16 = iVar16 + auVar6._8_4_;
          iVar17 = iVar17 + (uint)(uint3)(auVar5._10_3_ >> 0x10);
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x200);
        sprintf(local_18c,"%06o",iVar17 + iVar15 + iVar16 + iVar14);
        local_185 = 0x20;
      }
    }
  }
  tar->remaining_data = h->size;
  iVar14 = (*tar->write)(tar,local_220,0x200);
  tar->pos = tar->pos + 0x200;
  return iVar14;
}

Assistant:

int mtar_write_header(mtar_t *tar, const mtar_header_t *h) {
  mtar_raw_header_t rh;
  /* Build raw header and write */
  mtar_header_to_raw(&rh, h);
  tar->remaining_data = h->size;
  return mtar_twrite(tar, &rh, sizeof(rh));
}